

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall QGraphicsItem::hasFocus(QGraphicsItem *this)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsScenePrivate *pQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItem *in_RDI;
  QGraphicsScene *in_stack_ffffffffffffffe0;
  
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  if (pQVar2->scene != (QGraphicsScene *)0x0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&in_RDI->d_ptr);
    bVar1 = QGraphicsScene::isActive(in_stack_ffffffffffffffe0);
    if (bVar1) {
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RDI->d_ptr);
      if (pQVar2->focusProxy != (QGraphicsItem *)0x0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RDI->d_ptr);
        bVar1 = hasFocus(in_RDI);
        return bVar1;
      }
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDI->d_ptr);
      pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0x9768b6);
      if (pQVar3->focusItem != in_RDI) {
        return false;
      }
      pQVar4 = panel(in_RDI);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDI->d_ptr);
      pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0x9768f4);
      return pQVar4 == pQVar3->activePanel;
    }
  }
  return false;
}

Assistant:

bool QGraphicsItem::hasFocus() const
{
    if (!d_ptr->scene || !d_ptr->scene->isActive())
        return false;

    if (d_ptr->focusProxy)
        return d_ptr->focusProxy->hasFocus();

    if (d_ptr->scene->d_func()->focusItem != this)
        return false;

    return panel() == d_ptr->scene->d_func()->activePanel;
}